

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::zbranch(Forth *this)

{
  uint uVar1;
  uint flag;
  Forth *this_local;
  
  requireDStackDepth(this,1,"(ZBRANCH)");
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  if (uVar1 == this->False) {
    branch(this);
  }
  else {
    this->next_command = this->next_command + 4;
  }
  return;
}

Assistant:

void zbranch() {
			REQUIRE_DSTACK_DEPTH(1, "(ZBRANCH)");
			auto flag = dStack.getTop(); pop();
			if (flag == False)
				branch();
			else
				next_command += sizeof(next_command); 
		}